

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O3

void rotateImage(Mat *input,Mat *output,double alpha,double beta,double gamma,double dx,double dy,
                double dz,double f)

{
  undefined8 uVar1;
  Size SVar2;
  Size SVar3;
  Size SVar4;
  Mat *pMVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Mat R;
  Size local_7b8;
  Mat RY;
  Size local_758;
  Mat RZ;
  Size local_6f8;
  Mat A2;
  Mat trans;
  Mat RX;
  undefined1 local_550 [16];
  Size local_540;
  Size SStack_530;
  Mat local_4e0 [96];
  Mat aMStack_480 [144];
  undefined8 local_3f0;
  Mat bordered;
  undefined4 uStack_3e4;
  Mat local_3d8 [48];
  undefined8 *local_3a8;
  Mat local_378 [96];
  Mat aMStack_318 [144];
  Mat local_288 [16];
  undefined1 local_278 [16];
  Mat local_218 [96];
  Mat local_1b8 [152];
  _OutputArray local_120;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat T;
  Mat A1;
  
  dVar6 = (double)*(int *)(input + 0xc);
  dVar7 = (double)*(int *)(input + 8);
  cv::Mat::Mat(local_288,4,3,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = 1.0;
  _RX = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_RX == (Mat *)0x0) {
    _RX = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _RX = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  SVar4 = SStack_530;
  uVar1 = local_550._8_8_;
  *(double *)SVar2 = 0.0;
  if (_RX == (Mat *)0x0) {
    *(double *)SVar2 = dVar6 * -0.5;
LAB_00104c40:
    *(double *)SVar2 = 0.0;
LAB_00104c47:
    *(double *)SVar2 = dVar7 * -0.5;
LAB_00104c5c:
    *(double *)SVar2 = 0.0;
LAB_00104c63:
    *(double *)SVar2 = 0.0;
LAB_00104c6a:
    *(double *)SVar2 = 1.0;
LAB_00104eb3:
    pMVar5 = (Mat *)0x0;
  }
  else {
    SVar3 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SStack_530) {
      *(double *)SVar3 = dVar6 * -0.5;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = dVar6 * -0.5;
      if (_RX == (Mat *)0x0) goto LAB_00104c40;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104c47;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar4 <= (ulong)SVar3) {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 1.0;
      if (_RX != (Mat *)0x0) goto LAB_00104cfa;
      *(double *)SVar2 = 0.0;
LAB_00104ea2:
      *(double *)SVar2 = 0.0;
LAB_00104ea9:
      *(double *)SVar2 = 0.0;
LAB_00104eb0:
      *(double *)SVar2 = 1.0;
      goto LAB_00104eb3;
    }
    *(double *)SVar3 = 1.0;
    SVar2 = SVar3;
LAB_00104cfa:
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = dVar7 * -0.5;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = dVar7 * -0.5;
      if (_RX == (Mat *)0x0) goto LAB_00104c5c;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104ea2;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104c63;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104ea9;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104c6a;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 0.0;
      if (_RX == (Mat *)0x0) goto LAB_00104eb0;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 1.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RX,true);
      *(double *)SVar2 = 1.0;
      if (_RX == (Mat *)0x0) goto LAB_00104eb3;
    }
    pMVar5 = _RX;
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)SVar2)) {
      cv::MatConstIterator::seek((long)&RX,true);
      pMVar5 = _RX;
    }
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&A1,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::Mat::Mat(local_288,4,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = 1.0;
  _RY = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_RY == (Mat *)0x0) {
    _RY = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _RY = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  SVar4 = SStack_530;
  uVar1 = local_550._8_8_;
  *(double *)SVar2 = 0.0;
  if (_RY == (Mat *)0x0) {
LAB_00105036:
    *(double *)SVar2 = 0.0;
    local_758 = SVar2;
LAB_0010503d:
    *(double *)local_758 = 0.0;
  }
  else {
    SVar3 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SStack_530) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)SVar2 = 0.0;
      if (_RY == (Mat *)0x0) goto LAB_00105036;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
      if (_RY == (Mat *)0x0) goto LAB_0010503d;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
      if (_RY == (Mat *)0x0) goto LAB_001050f4;
    }
    local_758 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)SVar2)) {
      cv::MatConstIterator::seek((long)&RY,true);
      local_758 = SVar2;
    }
  }
LAB_001050f4:
  dVar8 = (alpha * 3.141592653589793) / 180.0;
  dVar9 = cos(dVar8);
  *(double *)local_758 = dVar9;
  SVar2 = local_758;
  if ((_RY != (Mat *)0x0) &&
     (SVar2 = (Size)(uVar1 + (long)local_758), (ulong)SVar4 <= (ulong)(uVar1 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar2 = local_758;
  }
  local_758 = SVar2;
  dVar9 = sin(dVar8);
  *(double *)local_758 = -dVar9;
  if (_RY == (Mat *)0x0) {
    *(double *)local_758 = 0.0;
LAB_001051e6:
    *(double *)local_758 = 0.0;
    SVar2 = local_758;
  }
  else {
    SVar2 = (Size)((long)local_758 + uVar1);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      if (_RY == (Mat *)0x0) goto LAB_001051e6;
    }
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      SVar2 = local_758;
      if (_RY == (Mat *)0x0) goto LAB_00105250;
    }
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_758)) {
      cv::MatConstIterator::seek((long)&RY,true);
      SVar2 = local_758;
    }
  }
LAB_00105250:
  local_758 = SVar2;
  dVar9 = sin(dVar8);
  *(double *)local_758 = dVar9;
  SVar2 = local_758;
  if ((_RY != (Mat *)0x0) &&
     (SVar2 = (Size)(uVar1 + (long)local_758), (ulong)SVar4 <= (ulong)(uVar1 + (long)local_758))) {
    cv::MatConstIterator::seek((long)&RY,true);
    SVar2 = local_758;
  }
  local_758 = SVar2;
  dVar8 = cos(dVar8);
  *(double *)local_758 = dVar8;
  if (_RY == (Mat *)0x0) {
    *(double *)local_758 = 0.0;
LAB_00105329:
    *(double *)local_758 = 0.0;
LAB_00105330:
    *(double *)local_758 = 1.0;
LAB_0010548b:
    pMVar5 = (Mat *)0x0;
  }
  else {
    SVar2 = (Size)((long)local_758 + uVar1);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      if (_RY == (Mat *)0x0) goto LAB_00105329;
    }
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar4 <= (ulong)SVar2) {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      if (_RY != (Mat *)0x0) goto LAB_0010536d;
LAB_00105420:
      *(double *)local_758 = 1.0;
      goto LAB_0010548b;
    }
    *(double *)SVar2 = 0.0;
    local_758 = SVar2;
LAB_0010536d:
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      if (_RY == (Mat *)0x0) goto LAB_00105330;
    }
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 0.0;
      if (_RY == (Mat *)0x0) goto LAB_00105420;
    }
    SVar2 = (Size)(uVar1 + (long)local_758);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 1.0;
      local_758 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RY,true);
      *(double *)local_758 = 1.0;
      if (_RY == (Mat *)0x0) goto LAB_0010548b;
    }
    pMVar5 = _RY;
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_758)) {
      cv::MatConstIterator::seek((long)&RY,true);
      pMVar5 = _RY;
    }
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&RX,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::Mat::Mat(local_288,4,4,6);
  dVar8 = (beta * 3.141592653589793) / 180.0;
  dVar9 = cos(dVar8);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = dVar9;
  _RZ = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_RZ == (Mat *)0x0) {
    _RZ = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _RZ = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  SVar4 = SStack_530;
  uVar1 = local_550._8_8_;
  *(double *)SVar2 = 0.0;
  local_6f8 = SVar2;
  if ((_RZ != (Mat *)0x0) &&
     (local_6f8 = (Size)(local_550._8_8_ + (long)SVar2),
     (ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)SVar2))) {
    cv::MatConstIterator::seek((long)&RZ,true);
    local_6f8 = SVar2;
  }
  dVar9 = sin(dVar8);
  *(double *)local_6f8 = -dVar9;
  if (_RZ == (Mat *)0x0) {
    *(double *)local_6f8 = 0.0;
LAB_001056b1:
    *(double *)local_6f8 = 1.0;
LAB_001056b4:
    *(double *)local_6f8 = 0.0;
    SVar2 = local_6f8;
  }
  else {
    SVar2 = (Size)((long)local_6f8 + uVar1);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_001056b1;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_001056b4;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 1.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 1.0;
      if (_RZ == (Mat *)0x0) goto LAB_001056b4;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_001056b4;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      SVar2 = local_6f8;
      if (_RZ == (Mat *)0x0) goto LAB_001056bb;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_6f8)) {
      cv::MatConstIterator::seek((long)&RZ,true);
      SVar2 = local_6f8;
    }
  }
LAB_001056bb:
  local_6f8 = SVar2;
  dVar9 = sin(dVar8);
  *(double *)local_6f8 = dVar9;
  SVar2 = local_6f8;
  if (_RZ == (Mat *)0x0) {
    *(double *)local_6f8 = 0.0;
  }
  else {
    SVar3 = (Size)((long)local_6f8 + uVar1);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      local_6f8 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_0010576a;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_6f8)) {
      cv::MatConstIterator::seek((long)&RZ,true);
      SVar2 = local_6f8;
    }
  }
LAB_0010576a:
  local_6f8 = SVar2;
  dVar8 = cos(dVar8);
  *(double *)local_6f8 = dVar8;
  if (_RZ == (Mat *)0x0) {
    *(double *)local_6f8 = 0.0;
LAB_00105806:
    *(double *)local_6f8 = 0.0;
LAB_0010580d:
    *(double *)local_6f8 = 1.0;
LAB_00105b28:
    pMVar5 = (Mat *)0x0;
  }
  else {
    SVar2 = (Size)((long)local_6f8 + uVar1);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_00105806;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar4 <= (ulong)SVar2) {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ != (Mat *)0x0) goto LAB_001058a9;
LAB_00105a31:
      *(double *)local_6f8 = 1.0;
      goto LAB_00105b28;
    }
    *(double *)SVar2 = 0.0;
    local_6f8 = SVar2;
LAB_001058a9:
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_0010580d;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 0.0;
      if (_RZ == (Mat *)0x0) goto LAB_00105a31;
    }
    SVar2 = (Size)(uVar1 + (long)local_6f8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 1.0;
      local_6f8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&RZ,true);
      *(double *)local_6f8 = 1.0;
      if (_RZ == (Mat *)0x0) goto LAB_00105b28;
    }
    pMVar5 = _RZ;
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_6f8)) {
      cv::MatConstIterator::seek((long)&RZ,true);
      pMVar5 = _RZ;
    }
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&RY,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::Mat::Mat(local_288,4,4,6);
  dVar8 = (gamma * 3.141592653589793) / 180.0;
  dVar9 = cos(dVar8);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = dVar9;
  _R = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_R == (Mat *)0x0) {
    _R = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _R = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  SVar4 = SStack_530;
  uVar1 = local_550._8_8_;
  dVar9 = sin(dVar8);
  *(double *)SVar2 = -dVar9;
  if (_R == (Mat *)0x0) {
    *(double *)SVar2 = 0.0;
LAB_00105cdf:
    *(double *)SVar2 = 0.0;
    local_7b8 = SVar2;
  }
  else {
    SVar3 = (Size)((long)SVar2 + uVar1);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)SVar2 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105cdf;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
      if (_R == (Mat *)0x0) goto LAB_00105d40;
    }
    local_7b8 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)SVar2)) {
      cv::MatConstIterator::seek((long)&R,true);
      local_7b8 = SVar2;
    }
  }
LAB_00105d40:
  dVar9 = sin(dVar8);
  *(double *)local_7b8 = dVar9;
  SVar2 = local_7b8;
  if ((_R != (Mat *)0x0) &&
     (SVar2 = (Size)(uVar1 + (long)local_7b8), (ulong)SVar4 <= (ulong)(uVar1 + (long)local_7b8))) {
    cv::MatConstIterator::seek((long)&R,true);
    SVar2 = local_7b8;
  }
  local_7b8 = SVar2;
  dVar8 = cos(dVar8);
  *(double *)local_7b8 = dVar8;
  if (_R == (Mat *)0x0) {
    *(double *)local_7b8 = 0.0;
LAB_00105e0c:
    *(double *)local_7b8 = 0.0;
LAB_00105e13:
    *(double *)local_7b8 = 1.0;
LAB_00105e16:
    *(double *)local_7b8 = 0.0;
LAB_00105e1d:
    *(double *)local_7b8 = 0.0;
LAB_00105e24:
    *(double *)local_7b8 = 1.0;
LAB_00105fab:
    pMVar5 = (Mat *)0x0;
  }
  else {
    SVar2 = (Size)((long)local_7b8 + uVar1);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105e0c;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar4 <= (ulong)SVar2) {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R != (Mat *)0x0) goto LAB_00105e5e;
LAB_00105f02:
      *(double *)local_7b8 = 0.0;
LAB_00105fa1:
      *(double *)local_7b8 = 0.0;
LAB_00105fa8:
      *(double *)local_7b8 = 1.0;
      goto LAB_00105fab;
    }
    *(double *)SVar2 = 0.0;
    local_7b8 = SVar2;
LAB_00105e5e:
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105e13;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105f02;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 1.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 1.0;
      if (_R == (Mat *)0x0) goto LAB_00105e16;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105fa1;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105e1d;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105fa8;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 0.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 0.0;
      if (_R == (Mat *)0x0) goto LAB_00105e24;
    }
    SVar2 = (Size)(uVar1 + (long)local_7b8);
    if ((ulong)SVar2 < (ulong)SVar4) {
      *(double *)SVar2 = 1.0;
      local_7b8 = SVar2;
    }
    else {
      cv::MatConstIterator::seek((long)&R,true);
      *(double *)local_7b8 = 1.0;
      if (_R == (Mat *)0x0) goto LAB_00105fab;
    }
    pMVar5 = _R;
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)local_7b8)) {
      cv::MatConstIterator::seek((long)&R,true);
      pMVar5 = _R;
    }
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&RZ,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::operator*(local_288,&RX);
  cv::operator*((MatExpr *)&bordered,local_288);
  cv::Mat::Mat(&R);
  (**(code **)(*(long *)CONCAT44(uStack_3e4,_bordered) + 0x18))
            ((long *)CONCAT44(uStack_3e4,_bordered),&bordered,&R,0xffffffff);
  cv::Mat::~Mat(aMStack_318);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat(local_3d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat((Mat *)local_278);
  cv::Mat::Mat(local_288,4,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = 1.0;
  _A2 = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_A2 == (Mat *)0x0) {
    _A2 = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _A2 = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  SVar4 = SStack_530;
  uVar1 = local_550._8_8_;
  *(double *)SVar2 = 0.0;
  if (_A2 == (Mat *)0x0) {
LAB_00106202:
    *(double *)SVar2 = dx;
LAB_0010620f:
    *(double *)SVar2 = 1.0;
LAB_00106212:
    *(double *)SVar2 = dy;
LAB_0010621f:
    *(double *)SVar2 = 0.0;
LAB_00106226:
    *(double *)SVar2 = dz;
LAB_00106233:
    *(double *)SVar2 = 0.0;
LAB_0010623a:
    *(double *)SVar2 = 1.0;
LAB_001064d1:
    pMVar5 = (Mat *)0x0;
  }
  else {
    SVar3 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SStack_530) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_00106202;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = dx;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = dx;
      if (_A2 == (Mat *)0x0) goto LAB_0010620f;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar4 <= (ulong)SVar3) {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 != (Mat *)0x0) goto LAB_001062d8;
LAB_001063a2:
      *(double *)SVar2 = 0.0;
LAB_001064bd:
      *(double *)SVar2 = 1.0;
LAB_001064c0:
      *(double *)SVar2 = 0.0;
LAB_001064c7:
      *(double *)SVar2 = 0.0;
LAB_001064ce:
      *(double *)SVar2 = 1.0;
      goto LAB_001064d1;
    }
    *(double *)SVar3 = 0.0;
    SVar2 = SVar3;
LAB_001062d8:
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 1.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 1.0;
      if (_A2 == (Mat *)0x0) goto LAB_00106212;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_001063a2;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = dy;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = dy;
      if (_A2 == (Mat *)0x0) goto LAB_0010621f;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_001064bd;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_00106226;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 1.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 1.0;
      if (_A2 == (Mat *)0x0) goto LAB_001064c0;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = dz;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = dz;
      if (_A2 == (Mat *)0x0) goto LAB_00106233;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_001064c7;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_0010623a;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 0.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 0.0;
      if (_A2 == (Mat *)0x0) goto LAB_001064ce;
    }
    SVar3 = (Size)(uVar1 + (long)SVar2);
    if ((ulong)SVar3 < (ulong)SVar4) {
      *(double *)SVar3 = 1.0;
      SVar2 = SVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&A2,true);
      *(double *)SVar2 = 1.0;
      if (_A2 == (Mat *)0x0) goto LAB_001064d1;
    }
    pMVar5 = _A2;
    if ((ulong)SVar4 <= (ulong)(uVar1 + (long)SVar2)) {
      cv::MatConstIterator::seek((long)&A2,true);
      pMVar5 = _A2;
    }
  }
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&T,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::Mat::Mat(local_288,3,4,6);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)local_550,local_288);
  *(double *)local_540 = f;
  _trans = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
  if (_trans == (Mat *)0x0) {
    _trans = (Mat *)0x0;
    SVar2 = local_540;
  }
  else {
    SVar2 = (Size)((long)local_540 + local_550._8_8_);
    if ((ulong)SStack_530 <= (ulong)((long)local_540 + local_550._8_8_)) {
      cv::MatConstIterator::seek((long)local_550,true);
      _trans = (Mat *)CONCAT44(local_550._4_4_,local_550._0_4_);
      SVar2 = local_540;
    }
  }
  *(double *)SVar2 = 0.0;
  if (_trans == (Mat *)0x0) {
    *(double *)SVar2 = dVar6 * 0.5;
LAB_001066a3:
    *(double *)SVar2 = 0.0;
LAB_001066aa:
    *(double *)SVar2 = f;
LAB_001066b7:
    *(double *)SVar2 = 0.0;
LAB_001066be:
    *(double *)SVar2 = 0.0;
LAB_001066c5:
    *(double *)SVar2 = 0.0;
  }
  else {
    SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar4 < (ulong)SStack_530) {
      *(double *)SVar4 = dVar6 * 0.5;
      SVar2 = SVar4;
    }
    else {
      cv::MatConstIterator::seek((long)&trans,true);
      *(double *)SVar2 = dVar6 * 0.5;
      if (_trans == (Mat *)0x0) goto LAB_001066a3;
    }
    SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar4 < (ulong)SStack_530) {
      *(double *)SVar4 = 0.0;
      SVar2 = SVar4;
    }
    else {
      cv::MatConstIterator::seek((long)&trans,true);
      *(double *)SVar2 = 0.0;
      if (_trans == (Mat *)0x0) goto LAB_001066aa;
    }
    SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
    if ((ulong)SVar4 < (ulong)SStack_530) {
      *(double *)SVar4 = 0.0;
      SVar2 = SVar4;
LAB_00106761:
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = f;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = f;
        if (_trans == (Mat *)0x0) goto LAB_001066b7;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = dVar7 * 0.5;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = dVar7 * 0.5;
        if (_trans == (Mat *)0x0) goto LAB_00106923;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = 0.0;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = 0.0;
        if (_trans == (Mat *)0x0) goto LAB_001066be;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = 0.0;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = 0.0;
        if (_trans == (Mat *)0x0) goto LAB_0010692a;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = 0.0;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = 0.0;
        if (_trans == (Mat *)0x0) goto LAB_001066c5;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = 1.0;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = 1.0;
        if (_trans == (Mat *)0x0) goto LAB_0010692d;
      }
      SVar4 = (Size)(local_550._8_8_ + (long)SVar2);
      if ((ulong)SVar4 < (ulong)SStack_530) {
        *(double *)SVar4 = 0.0;
        SVar2 = SVar4;
      }
      else {
        cv::MatConstIterator::seek((long)&trans,true);
        *(double *)SVar2 = 0.0;
        if (_trans == (Mat *)0x0) goto LAB_00106934;
      }
      pMVar5 = _trans;
      if ((ulong)SStack_530 <= (ulong)(local_550._8_8_ + (long)SVar2)) {
        cv::MatConstIterator::seek((long)&trans,true);
        pMVar5 = _trans;
      }
      goto LAB_00106937;
    }
    cv::MatConstIterator::seek((long)&trans,true);
    *(double *)SVar2 = 0.0;
    if (_trans != (Mat *)0x0) goto LAB_00106761;
    *(double *)SVar2 = dVar7 * 0.5;
LAB_00106923:
    *(double *)SVar2 = 0.0;
LAB_0010692a:
    *(double *)SVar2 = 1.0;
LAB_0010692d:
    *(double *)SVar2 = 0.0;
  }
LAB_00106934:
  pMVar5 = (Mat *)0x0;
LAB_00106937:
  cv::Mat::Mat(&bordered);
  _bordered = _bordered & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&bordered,pMVar5);
  cv::Mat::Mat(&A2,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(local_288);
  cv::operator*((Mat *)local_550,&R);
  cv::operator*(local_288,(MatExpr *)&T);
  cv::operator*(&bordered,(MatExpr *)&A2);
  cv::Mat::Mat(&trans);
  (**(code **)(*(long *)CONCAT44(uStack_3e4,_bordered) + 0x18))
            ((long *)CONCAT44(uStack_3e4,_bordered),&bordered,&trans,0xffffffff);
  cv::Mat::~Mat(aMStack_318);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat(local_3d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat((Mat *)local_278);
  cv::Mat::~Mat(aMStack_480);
  cv::Mat::~Mat(local_4e0);
  cv::Mat::~Mat((Mat *)(local_550 + 0x10));
  cv::Mat::Mat(&bordered);
  local_540.width = 0;
  local_540.height = 0;
  local_550._0_4_ = 0x1010000;
  local_120.super__InputArray.sz.width = 0;
  local_120.super__InputArray.sz.height = 0;
  local_120.super__InputArray.flags = 0x2010000;
  local_278 = ZEXT816(0);
  local_288 = (Mat  [16])ZEXT816(0);
  local_550._8_8_ = input;
  local_120.super__InputArray.obj = &bordered;
  cv::copyMakeBorder((_InputArray *)local_550,&local_120,*(int *)(input + 8),*(int *)(input + 8),
                     (int)((double)*(int *)(input + 0xc) * 0.3),
                     (int)((double)*(int *)(input + 0xc) * 0.3),0,(Scalar_ *)local_288);
  local_540.width = 0;
  local_540.height = 0;
  local_550._0_4_ = 0x1010000;
  local_120.super__InputArray.sz.width = 0;
  local_120.super__InputArray.sz.height = 0;
  local_120.super__InputArray.flags = 0x2010000;
  local_f8 = 0;
  local_108 = 0x1010000;
  local_3f0 = CONCAT44((int)*local_3a8,(int)((ulong)*local_3a8 >> 0x20));
  local_278 = (undefined1  [16])0x0;
  local_288[0] = (Mat)0x0;
  local_288[1] = (Mat)0x0;
  local_288[2] = (Mat)0x0;
  local_288[3] = (Mat)0x0;
  local_288[4] = (Mat)0x0;
  local_288[5] = (Mat)0x0;
  local_288[6] = (Mat)0x0;
  local_288[7] = (Mat)0x0;
  local_288[8] = (Mat)0x0;
  local_288[9] = (Mat)0x0;
  local_288[10] = (Mat)0x0;
  local_288[0xb] = (Mat)0x0;
  local_288[0xc] = (Mat)0x0;
  local_288[0xd] = (Mat)0x0;
  local_288[0xe] = (Mat)0x0;
  local_288[0xf] = (Mat)0x0;
  local_550._8_8_ = &bordered;
  local_120.super__InputArray.obj = output;
  local_100 = &trans;
  cv::warpPerspective();
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(&trans);
  cv::Mat::~Mat(&A2);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&R);
  cv::Mat::~Mat(&RZ);
  cv::Mat::~Mat(&RY);
  cv::Mat::~Mat(&RX);
  cv::Mat::~Mat(&A1);
  return;
}

Assistant:

void rotateImage(const cv::Mat &input,cv::Mat &output, double alpha, double beta, double gamma, double dx, double dy, double dz, double f) {
    alpha = (alpha)*CV_PI/180.;
    beta = (beta)*CV_PI/180.;
    gamma = (gamma)*CV_PI/180.;
    // get width and height for ease of use in cv::Matrices
    double w = (double)input.cols;
    double h = (double)input.rows;
    // Projection 2D -> 3D cv::Matrix
    cv::Mat A1 = (cv::Mat_<double>(4,3) <<
              1, 0, -w/2.,
              0, 1, -h/2.,
              0, 0, 0,
              0, 0, 1);
    // Rotation cv::Matrices around the X, Y, and Z axis
    cv::Mat RX = (cv::Mat_<double>(4, 4) <<
              1,          0,           0, 0,
              0, cos(alpha), -sin(alpha), 0,
              0, sin(alpha),  cos(alpha), 0,
              0,          0,           0, 1);
    cv::Mat RY = (cv::Mat_<double>(4, 4) <<
              cos(beta), 0, -sin(beta), 0,
              0, 1,          0, 0,
              sin(beta), 0,  cos(beta), 0,
              0, 0,          0, 1);
    cv::Mat RZ = (cv::Mat_<double>(4, 4) <<
              cos(gamma), -sin(gamma), 0, 0,
              sin(gamma),  cos(gamma), 0, 0,
              0,          0,           1, 0,
              0,          0,           0, 1);
    // Composed rotation cv::Matrix with (RX, RY, RZ)
    cv::Mat R = RX * RY * RZ;
    // Translation cv::Matrix
    cv::Mat T = (cv::Mat_<double>(4, 4) <<
             1, 0, 0, dx,
             0, 1, 0, dy,
             0, 0, 1, dz,
             0, 0, 0, 1);
    // 3D -> 2D cv::Matrix
    cv::Mat A2 = (cv::Mat_<double>(3,4) <<
              f, 0, w/2, 0,
              0, f, h/2, 0,
              0, 0,   1, 0);
    // Final transforcv::Mation cv::Matrix
    cv::Mat trans = A2 * (T * (R * A1));
    // Apply cv::Matrix transforcv::Mation
    cv::Mat bordered;
    cv::copyMakeBorder(input, bordered, input.rows, input.rows, input.cols*.3, input.cols*.3, cv::BORDER_CONSTANT, cv::Scalar(0,0,0));
    cv::warpPerspective(bordered, output, trans, bordered.size(), cv::INTER_LANCZOS4);
}